

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall
kratos::RemovePassThroughVisitor::visit(RemovePassThroughVisitor *this,Generator *generator)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Var *new_var;
  _Rb_tree_node_base *p_Var3;
  InternalException *this_00;
  undefined1 auVar4 [8];
  element_type *peVar5;
  _Rb_tree_node_base *p_Var6;
  shared_ptr<kratos::Generator> *child;
  pointer __args;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  local_100;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_e8;
  Var *local_d0;
  _Rb_tree_node_base *local_c8;
  pointer local_c0;
  pointer local_b8;
  pointer ppStack_b0;
  pointer local_a8;
  undefined1 auStack_98 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  child_to_remove;
  undefined1 local_68 [8];
  shared_ptr<kratos::Port> port;
  string var_name;
  
  Generator::get_child_generators(&local_100,generator);
  auStack_98 = (undefined1  [8])0x0;
  child_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  child_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_100.
      super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_100.
      super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args = local_100.
             super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar1 = is_pass_through(this,(__args->
                                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
      if (bVar1) {
        std::
        vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>
        ::emplace_back<std::shared_ptr<kratos::Generator>const&>
                  ((vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>
                    *)auStack_98,__args);
        peVar5 = (__args->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar5->is_cloned_ == false) {
          port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
          std::
          _Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<kratos::Generator*>
                    ((_Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&this->pass_through_,
                     &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
        }
      }
      __args = __args + 1;
    } while (__args != local_100.
                       super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    local_c0 = child_to_remove.
               super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (auStack_98 !=
        (undefined1  [8])
        child_to_remove.
        super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __return_storage_ptr__ =
           &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      auVar4 = auStack_98;
      do {
        peVar5 = (((pointer)auVar4)->
                 super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar5->is_cloned_ == true) {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&var_name._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     "Unable to optimize passthrough on cloned generator","");
          InternalException::InternalException
                    (this_00,(string *)
                             &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        p_Var3 = (peVar5->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var6 = &(peVar5->ports_)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_c8 = p_Var6;
        if (p_Var3 != p_Var6) {
          do {
            Generator::get_port((Generator *)local_68,
                                (string *)
                                (((pointer)auVar4)->
                                super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
            if (*(int *)&(((Var *)((long)local_68 + 0x270))->super_IRNode)._vptr_IRNode == 0) {
              iVar2 = (*((IRNode *)local_68)->_vptr_IRNode[0xe])();
              local_d0 = *(Var **)(*(long *)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) + 8) +
                                  0xc0);
              Generator::get_unique_variable_name
                        ((string *)__return_storage_ptr__,generator,
                         &((((pointer)auVar4)->
                           super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                          )->instance_name,(string *)((long)local_68 + 0x78));
              new_var = Generator::var(generator,(string *)__return_storage_ptr__,
                                       *(uint32_t *)((long)local_68 + 0x98),
                                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       ((long)local_68 + 0xa0),*(bool *)((long)local_68 + 0xf0));
              if (generator->debug == true) {
                peVar5 = (((pointer)auVar4)->
                         super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                std::
                vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                ::
                vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                          ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                            *)&local_b8,
                           (peVar5->super_IRNode).fn_name_ln.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (peVar5->super_IRNode).fn_name_ln.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (allocator_type *)(var_name.field_2._M_local_buf + 0xf));
                local_e8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (new_var->super_IRNode).fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_e8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (new_var->super_IRNode).fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_e8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (new_var->super_IRNode).fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                (new_var->super_IRNode).fn_name_ln.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start = local_b8;
                (new_var->super_IRNode).fn_name_ln.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppStack_b0;
                (new_var->super_IRNode).fn_name_ln.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = local_a8;
                local_b8 = (pointer)0x0;
                ppStack_b0 = (pointer)0x0;
                local_a8 = (pointer)0x0;
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::~vector(&local_e8);
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)&local_b8);
                local_e8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_e8.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,0x137);
                std::
                vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                ::emplace_back<char_const(&)[81],int>
                          ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                            *)&(new_var->super_IRNode).fn_name_ln,
                           (char (*) [81])
                           "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                           ,(int *)&local_e8);
                p_Var6 = local_c8;
              }
              Var::move_src_to((Var *)local_68,new_var,generator,false);
              Var::move_sink_to(local_d0,new_var,generator,false);
              if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           &var_name._M_string_length) {
                operator_delete(port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi,var_name._M_string_length + 1);
              }
            }
            if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            }
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
          } while (p_Var3 != p_Var6);
          peVar5 = (((pointer)auVar4)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        }
        std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::Generator,void>
                  ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
                   __return_storage_ptr__,
                   (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                   &peVar5->super_enable_shared_from_this<kratos::Generator>);
        Generator::remove_child_generator
                  (generator,(shared_ptr<kratos::Generator> *)__return_storage_ptr__);
        if (var_name._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var_name._M_dataplus._M_p);
        }
        auVar4 = (undefined1  [8])((long)auVar4 + 0x10);
      } while (auVar4 != (undefined1  [8])local_c0);
    }
  }
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           *)auStack_98);
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector(&local_100);
  return;
}

Assistant:

void visit(Generator* generator) override {
        const auto& children = generator->get_child_generators();
        std::vector<std::shared_ptr<Generator>> child_to_remove;
        for (auto const& child : children) {
            if (is_pass_through(child.get())) {
                // need to remove it
                child_to_remove.emplace_back(child);
                // add it to the set
                if (!child->is_cloned()) pass_through_.emplace(child.get());
            }
        }

        for (auto const& child : child_to_remove) {
            if (child->is_cloned())
                throw InternalException("Unable to optimize passthrough on cloned generator");
            // we move the src and sinks around
            const auto& port_names = child->get_port_names();
            for (auto const& port_name : port_names) {
                auto port = child->get_port(port_name);
                if (port->port_direction() == PortDirection::In) {
                    // move the src to whatever it's connected to
                    // basically compress the module into a variable
                    // we will let the later downstream passes to remove the extra wiring
                    auto* next_port = (*(port->sinks().begin()))->left();
                    auto var_name =
                        generator->get_unique_variable_name(child->instance_name, port->name);
                    auto& new_var = generator->var(var_name, port->var_width(), port->size(),
                                                   port->is_signed());
                    if (generator->debug) {
                        // need to copy the changes over
                        new_var.fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                            child->fn_name_ln.begin(), child->fn_name_ln.end());
                        new_var.fn_name_ln.emplace_back(__FILE__, __LINE__);
                    }
                    Var::move_src_to(port.get(), &new_var, generator, false);
                    // move the sinks over
                    Var::move_sink_to(next_port, &new_var, generator, false);
                }
            }
            // remove it from the generator children
            generator->remove_child_generator(child->shared_from_this());
        }
    }